

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::create_color_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  bool bVar1;
  color_quad_u8 (*pacVar2) [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  endpoint_indices_details *peVar6;
  color_cluster *pcVar7;
  color_cluster *pcVar8;
  uint *puVar9;
  color_selector_details *pcVar10;
  selector_indices_details *psVar11;
  uint local_13e0;
  uint local_13b4;
  uint local_13a4;
  uint local_1398;
  uint local_1394;
  uint s_4;
  uint p_3;
  uint (*total_errors) [16] [4];
  uint error;
  uint32 selector;
  uint s_3;
  uint best_error;
  uint best_index;
  uint s_2;
  uint p_2;
  uint s_1;
  uint p_1;
  uint s;
  uint p;
  color_quad_u8 *endpoint_colors;
  color_cluster *cluster;
  uint local_1340;
  uint bEnd;
  uint b;
  uint n;
  uint E8 [4] [256];
  uint E4 [8] [16];
  uint E2 [16] [4];
  uint num_tasks;
  vector<crnlib::color_selector_details> *selector_details;
  void *pData_ptr_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  uVar3 = task_pool::get_num_threads(this->m_pTask_pool);
  if ((this->m_has_subblocks & 1U) == 0) {
    local_13a4 = this->m_num_blocks;
  }
  else {
    local_13a4 = this->m_num_blocks >> 1;
  }
  for (local_1340 = (uint)((local_13a4 * data) / (ulong)(uVar3 + 1));
      local_1340 < (uint)(((ulong)local_13a4 * (data + 1)) / (ulong)(uVar3 + 1));
      local_1340 = local_1340 + 1) {
    peVar6 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                       (&this->m_endpoint_indices,local_1340);
    pcVar7 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                       (&this->m_color_clusters,(uint)(peVar6->field_0).field_0.color);
    for (p_1 = 0; p_1 < 0x10; p_1 = p_1 + 1) {
      for (s_1 = 0; s_1 < 4; s_1 = s_1 + 1) {
        if ((this->m_has_subblocks & 1U) == 0) {
          local_13b4 = crnlib::color::color_distance
                                 ((bool)((this->m_params).m_perceptual & 1),
                                  this->m_blocks[local_1340] + p_1,pcVar7->color_values + s_1,false)
          ;
        }
        else {
          bVar1 = (this->m_params).m_perceptual;
          pacVar2 = this->m_blocks;
          peVar6 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                             (&this->m_endpoint_indices,local_1340 << 1 | p_1 >> 3);
          pcVar8 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                             (&this->m_color_clusters,(uint)(peVar6->field_0).field_0.color);
          local_13b4 = crnlib::color::color_distance
                                 ((bool)(bVar1 & 1),pacVar2[local_1340] + p_1,
                                  pcVar8->color_values + s_1,false);
        }
        E2[(ulong)p_1 - 1][(ulong)s_1 + 2] = local_13b4;
      }
    }
    for (p_2 = 0; p_2 < 8; p_2 = p_2 + 1) {
      for (s_2 = 0; s_2 < 0x10; s_2 = s_2 + 1) {
        E4[(ulong)p_2 - 1][(ulong)s_2 + 0xe] =
             E2[(ulong)(p_2 << 1) - 1][(ulong)(s_2 & 3) + 2] +
             E2[(ulong)(p_2 << 1 | 1) - 1][(ulong)(s_2 >> 2) + 2];
      }
    }
    for (best_index = 0; best_index < 4; best_index = best_index + 1) {
      for (best_error = 0; best_error < 0x100; best_error = best_error + 1) {
        (&b)[(ulong)best_index * 0x100 + (ulong)best_error] =
             E4[(ulong)(best_index << 1) - 1][(ulong)(best_error & 0xf) + 0xe] +
             E4[(ulong)(best_index << 1 | 1) - 1][(ulong)(best_error >> 4) + 0xe];
      }
    }
    s_3 = 0;
    selector = 0xffffffff;
    error = 0;
    while( true ) {
      uVar4 = vector<unsigned_int>::size(&this->m_color_selectors);
      if (uVar4 <= error) break;
      puVar9 = vector<unsigned_int>::operator[](&this->m_color_selectors,error);
      uVar5 = *puVar9;
      uVar5 = (&b)[uVar5 & 0xff] + E8[0][(ulong)(uVar5 >> 8 & 0xff) + 0xfe] +
              E8[1][(ulong)(uVar5 >> 0x10 & 0xff) + 0xfe] + E4[-0x11][(ulong)(uVar5 >> 0x18) + 0xe];
      if (uVar5 < selector) {
        s_3 = error;
        selector = uVar5;
      }
      error = error + 1;
    }
    pcVar10 = vector<crnlib::color_selector_details>::operator[]
                        ((vector<crnlib::color_selector_details> *)pData_ptr,s_3);
    for (local_1394 = 0; local_1394 < 0x10; local_1394 = local_1394 + 1) {
      for (local_1398 = 0; local_1398 < 4; local_1398 = local_1398 + 1) {
        pcVar10->error[local_1394][local_1398] =
             E2[(ulong)local_1394 - 1][(ulong)local_1398 + 2] +
             pcVar10->error[local_1394][local_1398];
      }
    }
    pcVar10 = vector<crnlib::color_selector_details>::operator[]
                        ((vector<crnlib::color_selector_details> *)pData_ptr,s_3);
    pcVar10->used = true;
    if ((this->m_has_subblocks & 1U) == 0) {
      local_13e0 = local_1340;
    }
    else {
      local_13e0 = local_1340 << 1;
    }
    psVar11 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                        (&this->m_selector_indices,local_13e0);
    (psVar11->field_0).field_0.color = (uint16)s_3;
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook_task(uint64 data, void* pData_ptr)
    {
        crnlib::vector<color_selector_details>& selector_details = *static_cast<crnlib::vector<color_selector_details>*>(pData_ptr);
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint E2[16][4];
        uint E4[8][16];
        uint E8[4][256];
        for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++)
        {
            color_cluster& cluster = m_color_clusters[m_endpoint_indices[b].color];
            color_quad_u8* endpoint_colors = cluster.color_values;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    E2[p][s] = m_has_subblocks ? color::color_distance(m_params.m_perceptual, m_blocks[b][p], m_color_clusters[m_endpoint_indices[b << 1 | p >> 3].color].color_values[s], false) : color::color_distance(m_params.m_perceptual, m_blocks[b][p], endpoint_colors[s], false);
                }
            }
            for (uint p = 0; p < 8; p++)
            {
                for (uint s = 0; s < 16; s++)
                {
                    E4[p][s] = E2[p << 1][s & 3] + E2[p << 1 | 1][s >> 2];
                }
            }
            for (uint p = 0; p < 4; p++)
            {
                for (uint s = 0; s < 256; s++)
                {
                    E8[p][s] = E4[p << 1][s & 15] + E4[p << 1 | 1][s >> 4];
                }
            }
            uint best_index = 0;
            for (uint best_error = cUINT32_MAX, s = 0; s < m_color_selectors.size(); s++)
            {
                uint32 selector = m_color_selectors[s];
                uint error = E8[0][selector & 255] + E8[1][selector >> 8 & 255] + E8[2][selector >> 16 & 255] + E8[3][selector >> 24 & 255];
                if (error < best_error)
                {
                    best_error = error;
                    best_index = s;
                }
            }
            uint(&total_errors)[16][4] = selector_details[best_index].error;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    total_errors[p][s] += E2[p][s];
                }
            }
            selector_details[best_index].used = true;
            m_selector_indices[m_has_subblocks ? b << 1 : b].color = best_index;
        }
    }